

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O0

void Hop_TableInsert(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t **ppHVar4;
  Hop_Obj_t **ppPlace;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x67,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  pHVar3 = Hop_TableLookup(p,pObj);
  if (pHVar3 == (Hop_Obj_t *)0x0) {
    if ((pObj->Id & 0xffU) == 0) {
      iVar1 = p->nTableSize;
      iVar2 = Hop_ManNodeNum(p);
      if (iVar1 << 1 < iVar2) {
        Hop_TableResize(p);
      }
    }
    ppHVar4 = Hop_TableFind(p,pObj);
    if (*ppHVar4 == (Hop_Obj_t *)0x0) {
      *ppHVar4 = pObj;
      return;
    }
    __assert_fail("*ppPlace == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x6c,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  __assert_fail("Hop_TableLookup(p, pObj) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                ,0x68,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_TableInsert( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppPlace;
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Hop_ManNodeNum(p) )
        Hop_TableResize( p );
    ppPlace = Hop_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}